

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node)

{
  uint uVar1;
  int local_84;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT local;
  REF_INT i;
  REF_INT nactive;
  REF_INT active1;
  REF_INT active0;
  REF_INT chunk;
  REF_INT part;
  REF_INT total_active;
  REF_GLOB total_unused;
  REF_GLOB *unused;
  REF_INT *active_counts;
  REF_INT *counts;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  
  counts = &ref_node->ref_mpi->n;
  ref_mpi = (REF_MPI)ref_node;
  uVar1 = ref_sort_in_place_glob(ref_node->n_unused,ref_node->unused_global);
  if (uVar1 == 0) {
    if (*counts < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x27f,
             "ref_node_eliminate_unused_globals","malloc counts of REF_INT negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      active_counts = (REF_INT *)malloc((long)*counts << 2);
      if (active_counts == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x27f,"ref_node_eliminate_unused_globals","malloc counts of REF_INT NULL");
        ref_node_local._4_4_ = 2;
      }
      else if (*counts < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x280,"ref_node_eliminate_unused_globals","malloc active_counts of REF_INT negative")
        ;
        ref_node_local._4_4_ = 1;
      }
      else {
        unused = (REF_GLOB *)malloc((long)*counts << 2);
        if (unused == (REF_GLOB *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x280,"ref_node_eliminate_unused_globals","malloc active_counts of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          uVar1 = ref_mpi_allgather((REF_MPI)counts,&ref_mpi[1].first_time,active_counts,1);
          if (uVar1 == 0) {
            _part = 0;
            for (active0 = 0; active0 < *counts; active0 = active0 + 1) {
              _part = active_counts[active0] + _part;
            }
            local_84 = (int)(_part / (long)*counts) + 1;
            if (local_84 < 0x186a1) {
              local_84 = 100000;
            }
            active1 = local_84;
            nactive = 0;
            while (nactive < *counts) {
              uVar1 = ref_node_eliminate_active_parts
                                (*counts,active_counts,active1,nactive,&i,&local);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x291,"ref_node_eliminate_unused_globals",(ulong)uVar1,"active part range");
                return uVar1;
              }
              for (active0 = 0; active0 < *counts; active0 = active0 + 1) {
                *(undefined4 *)((long)unused + (long)active0 * 4) = 0;
              }
              for (active0 = nactive; active0 < i; active0 = active0 + 1) {
                *(REF_INT *)((long)unused + (long)active0 * 4) = active_counts[active0];
              }
              chunk = 0;
              for (active0 = nactive; active0 < i; active0 = active0 + 1) {
                chunk = *(int *)((long)unused + (long)active0 * 4) + chunk;
              }
              if (chunk < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a0,"ref_node_eliminate_unused_globals",
                       "malloc unused of REF_GLOB negative");
                return 1;
              }
              total_unused = (REF_GLOB)malloc((long)chunk << 3);
              if ((void *)total_unused == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a0,"ref_node_eliminate_unused_globals","malloc unused of REF_GLOB NULL");
                return 2;
              }
              uVar1 = ref_mpi_allgatherv((REF_MPI)counts,*(void **)&ref_mpi[1].native_alltoallv,
                                         (REF_INT *)unused,(void *)total_unused,2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a3,"ref_node_eliminate_unused_globals",(ulong)uVar1,
                       "gather active unused");
                return uVar1;
              }
              uVar1 = ref_sort_in_place_glob(chunk,(REF_GLOB *)total_unused);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2a5,"ref_node_eliminate_unused_globals",(ulong)uVar1,"in place sort");
                return uVar1;
              }
              if ((nactive <= counts[1]) && (counts[1] < i)) {
                *(undefined4 *)&ref_mpi[1].first_time = 0;
              }
              uVar1 = ref_node_eliminate_unused_offset
                                (ref_mpi->n,(REF_GLOB *)ref_mpi->start_time,chunk,
                                 (REF_GLOB *)total_unused);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2af,"ref_node_eliminate_unused_globals",(ulong)uVar1,
                       "offset sorted globals");
                return uVar1;
              }
              uVar1 = ref_node_eliminate_unused_offset
                                (*(REF_INT *)&ref_mpi[1].first_time,
                                 *(REF_GLOB **)&ref_mpi[1].native_alltoallv,chunk,
                                 (REF_GLOB *)total_unused);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x2b5,"ref_node_eliminate_unused_globals",(ulong)uVar1,
                       "offset sorted unused");
                return uVar1;
              }
              if (total_unused != 0) {
                free((void *)total_unused);
              }
              nactive = i;
            }
            for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_mpi->n;
                ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
              *(undefined8 *)
               ((long)ref_mpi->comm +
               (long)*(int *)((long)ref_mpi->first_time + (long)ref_private_macro_code_rss * 4) * 8)
                   = *(undefined8 *)
                      ((long)ref_mpi->start_time + (long)ref_private_macro_code_rss * 8);
            }
            uVar1 = ref_node_initialize_n_global
                              ((REF_NODE)ref_mpi,*(long *)&ref_mpi[1].timing - _part);
            if (uVar1 == 0) {
              if (unused != (REF_GLOB *)0x0) {
                free(unused);
              }
              if (active_counts != (REF_INT *)0x0) {
                free(active_counts);
              }
              ref_node_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x2c4,"ref_node_eliminate_unused_globals",(ulong)uVar1,"re-init");
              ref_node_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x283,"ref_node_eliminate_unused_globals",(ulong)uVar1,"gather size");
            ref_node_local._4_4_ = uVar1;
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x27c,
           "ref_node_eliminate_unused_globals",(ulong)uVar1,"in place");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *counts, *active_counts;
  REF_GLOB *unused;
  REF_GLOB total_unused;
  REF_INT total_active;
  REF_INT part, chunk;
  REF_INT active0, active1, nactive;
  REF_INT i, local;

  /* sort so that decrement of future processed unused works */
  RSS(ref_sort_in_place_glob(ref_node_n_unused(ref_node),
                             ref_node->unused_global),
      "in place");

  /* share unused count */
  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(active_counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &(ref_node_n_unused(ref_node)), counts,
                        REF_INT_TYPE),
      "gather size");
  total_unused = 0;
  each_ref_mpi_part(ref_mpi, part) total_unused += counts[part];

  /* heuristic of max to process at a time */
  chunk = (REF_INT)(total_unused / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);

  /* while have unused to process */
  active0 = 0;
  while (active0 < ref_mpi_n(ref_mpi)) {
    /* processor [active0, active1) slice of at least one and less than chunk */
    RSS(ref_node_eliminate_active_parts(ref_mpi_n(ref_mpi), counts, chunk,
                                        active0, &active1, &nactive),
        "active part range");

    /* active unused count and share active unused list, sorted */
    each_ref_mpi_part(ref_mpi, part) active_counts[part] = 0;
    for (part = active0; part < active1; part++) {
      active_counts[part] = counts[part];
    }

    /* count active unused (between active0 and active1-1) */
    total_active = 0;
    for (part = active0; part < active1; part++) {
      total_active += active_counts[part];
    }

    /* gather active unused, and sort */
    ref_malloc(unused, total_active, REF_GLOB);
    RSS(ref_mpi_allgatherv(ref_mpi, ref_node->unused_global, active_counts,
                           unused, REF_GLOB_TYPE),
        "gather active unused");
    /* (each part already sorted, merge sort faster? */
    RSS(ref_sort_in_place_glob(total_active, unused), "in place sort");

    /* erase unused gathered in active unused list */
    if (active0 <= ref_mpi_rank(ref_mpi) && ref_mpi_rank(ref_mpi) < active1)
      ref_node_n_unused(ref_node) = 0;

    /* shift ref_node sorted_globals */
    RSS(ref_node_eliminate_unused_offset(ref_node_n(ref_node),
                                         ref_node->sorted_global, total_active,
                                         unused),
        "offset sorted globals");

    /* shift unprocessed unused */
    RSS(ref_node_eliminate_unused_offset(ref_node_n_unused(ref_node),
                                         ref_node->unused_global, total_active,
                                         unused),
        "offset sorted unused");
    ref_free(unused);

    active0 = active1;
  }

  /* update node global with shifted sorted_global */
  for (i = 0; i < ref_node_n(ref_node); i++) {
    local = ref_node->sorted_local[i];
    ref_node->global[local] = ref_node->sorted_global[i];
  }

  /* set compact global count */
  RSS(ref_node_initialize_n_global(ref_node,
                                   ref_node->old_n_global - total_unused),
      "re-init");

  ref_free(active_counts);
  ref_free(counts);
  return REF_SUCCESS;
}